

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::Doctype(cmXMLWriter *this,char *doctype)

{
  ostream *poVar1;
  char *doctype_local;
  cmXMLWriter *this_local;
  
  CloseStartElement(this);
  ConditionalLineBreak(this,(bool)((this->IsContent ^ 0xffU) & 1));
  poVar1 = std::operator<<(this->Output,"<!DOCTYPE ");
  poVar1 = std::operator<<(poVar1,doctype);
  std::operator<<(poVar1,">");
  return;
}

Assistant:

void cmXMLWriter::Doctype(const char* doctype)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent);
  this->Output << "<!DOCTYPE " << doctype << ">";
}